

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::DebugCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  Output local_20;
  char *local_18;
  
  sVar1 = DAT_001b6788;
  if (params != (char *)0x0 && DAT_001b6788 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
    if (iVar2 == 0) {
      if (params[sVar1] != '\0') {
        iVar2 = isspace((int)params[sVar1]);
        if (iVar2 == 0) goto LAB_0013498b;
      }
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,token::Debug_abi_cxx11_,DAT_001b6708);
      Output::~Output(&local_20);
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Toggle debug mode.",0x12);
      goto LAB_001349e3;
    }
  }
LAB_0013498b:
  ChessEngine::_debug = ChessEngine::_debug ^ 1;
  Output::Output(&local_20,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"debug ",6);
  local_18 = "off";
  if (ChessEngine::_debug != 0) {
    local_18 = "on";
  }
  Output::operator<<(&local_20,&local_18);
LAB_001349e3:
  Output::~Output(&local_20);
  return;
}

Assistant:

void UCIAdapter::DebugCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Debug;
    Output() << "Toggle debug mode.";
    return;
  }

  engine->SetDebug(!engine->IsDebugOn());
  Output() << "debug " << (engine->IsDebugOn() ? "on" : "off");
}